

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

void __thiscall File::output_text(File *this,ostream *out)

{
  ushort uVar1;
  Constant *pCVar2;
  Instruction *pIVar3;
  pointer pFVar4;
  pointer pcVar5;
  pointer pCVar6;
  char cVar7;
  variant_alternative_t<0UL,_variant<basic_string<char>,_int,_double>_> *pvVar8;
  undefined8 uVar9;
  ulong uVar10;
  int iVar11;
  Instruction *ins_1;
  pointer args_1;
  pointer pCVar12;
  Constant *constant;
  Constant *t;
  Instruction *t_00;
  File *pFVar13;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  string name;
  int local_7c;
  File *local_78;
  int local_6c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  value_type local_50;
  
  local_7c = 0;
  std::__ostream_insert<char,std::char_traits<char>>(out,".constants:",0xb);
  cVar7 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  pCVar2 = (this->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl
           .super__Vector_impl_data._M_finish;
  local_78 = this;
  iVar11 = local_7c;
  for (t = (this->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl
           .super__Vector_impl_data._M_start; t != pCVar2; t = t + 1) {
    local_7c = iVar11 + 1;
    std::ostream::operator<<((ostream *)out,iVar11);
    std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
    print<vm::Constant>(out,t);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar7);
    std::ostream::put(cVar7);
    std::ostream::flush();
    iVar11 = local_7c;
  }
  local_7c = 0;
  std::__ostream_insert<char,std::char_traits<char>>(out,".start:",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  pIVar3 = (local_78->start).super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  iVar11 = local_7c;
  for (t_00 = (local_78->start).
              super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
              super__Vector_impl_data._M_start; t_00 != pIVar3; t_00 = t_00 + 1) {
    local_7c = iVar11 + 1;
    std::ostream::operator<<((ostream *)out,iVar11);
    std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
    print<vm::Instruction>(out,t_00);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar7);
    std::ostream::put(cVar7);
    std::ostream::flush();
    iVar11 = local_7c;
  }
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7c = 0;
  std::__ostream_insert<char,std::char_traits<char>>(out,".functions:",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  args_1 = (local_78->functions).super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pFVar4 = (local_78->functions).super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (args_1 != pFVar4) {
    do {
      uVar1 = args_1->nameIndex;
      pCVar12 = (local_78->constants).
                super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar10 = ((long)(local_78->constants).
                      super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pCVar12 >> 4) * -0x5555555555555555;
      if (uVar10 < uVar1 || uVar10 - uVar1 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        goto LAB_001101bd;
      }
      pvVar8 = std::get<0ul,std::__cxx11::string,int,double>
                         ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                           *)((long)&(pCVar12->value).
                                     super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                                     .
                                     super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>
                             + (ulong)((uint)uVar1 * 0x30)));
      pcVar5 = (pvVar8->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar5,pcVar5 + pvVar8->_M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_68,&local_50);
      local_6c = local_7c;
      local_7c = local_7c + 1;
      println<int,unsigned_short,unsigned_short,unsigned_short,char[2],std::__cxx11::string>
                (out,&local_6c,&args_1->nameIndex,&args_1->paramSize,&args_1->level,
                 (char (*) [2])"#",&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      args_1 = args_1 + 1;
    } while (args_1 != pFVar4);
  }
  local_7c = 0;
  pFVar13 = (File *)(local_78->functions).
                    super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
                    super__Vector_impl_data._M_start;
  local_78 = (File *)(local_78->functions).
                     super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
                     super__Vector_impl_data._M_finish;
  if (pFVar13 != local_78) {
    do {
      if ((ulong)((long)local_68.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_68.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)(long)local_7c) {
LAB_001101bd:
        uVar9 = std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68);
        _Unwind_Resume(uVar9);
      }
      printfmt<int,std::__cxx11::string>
                (out,".F{}: # {}",&local_7c,
                 local_68.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + local_7c);
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
      pCVar12 = (pFVar13->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar6 = (pFVar13->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pCVar12 != pCVar6) {
        iVar11 = 0;
        do {
          std::ostream::operator<<((ostream *)out,iVar11);
          std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
          print<vm::Instruction>(out,(Instruction *)pCVar12);
          std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar7);
          std::ostream::put(cVar7);
          std::ostream::flush();
          iVar11 = iVar11 + 1;
          pCVar12 = (pointer)((long)&(pCVar12->value).
                                     super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                                     .
                                     super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>
                                     .
                                     super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>
                                     .
                                     super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>
                                     .
                                     super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>
                                     .
                                     super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double>
                             + 4);
        } while (pCVar12 != pCVar6);
      }
      local_7c = local_7c + 1;
      pFVar13 = (File *)&pFVar13->start;
    } while (pFVar13 != local_78);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return;
}

Assistant:

void File::output_text(std::ostream& out) {
    int i;
    
    i = 0;
    println(out, ".constants:");
    for (auto& constant : constants) {
        println(out, i++, constant);
    }

    i = 0;
    println(out, ".start:");
    for (auto& ins : start) {
        println(out, i++, ins);
    }

    std::vector<std::string> names;
    i = 0;
    println(out, ".functions:");
    for (auto& fun : functions) {
        std::string name = std::get<std::string>(constants.at(fun.nameIndex).value);
        names.push_back(name);
        println(out, i++, fun.nameIndex, fun.paramSize, fun.level, "#", name);
    }
    
    i = 0;
    for (auto& fun : functions) {
        printfmt(out, ".F{}: # {}", i, names.at(i)); println(out);
        int j = 0;
        for (auto& ins : fun.instructions) {
            println(out, j++, ins);
        }
        ++i;
    }
}